

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void NetUpdate(void)

{
  void *__src;
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  byte bVar8;
  SWORD SVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int *piVar14;
  int iVar15;
  bool bVar16;
  long lVar17;
  usercmd_t *basis;
  ticcmd_t *basis_00;
  int iVar18;
  int iVar19;
  ulong uVar20;
  size_t __n;
  int iVar21;
  int iVar23;
  undefined1 auVar22 [16];
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  BYTE *cmddata;
  BYTE playerbytes [8];
  uint local_74;
  BYTE *local_70;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  uint local_50;
  int local_4c;
  long *local_48;
  ulong local_40;
  byte abStack_38 [8];
  
  if (GC::Threshold <= GC::AllocBytes) {
    GC::Step();
  }
  iVar3 = nettics[0];
  iVar10 = resendto[0];
  if (ticdup != 0) {
    iVar15 = 0;
    iVar3 = (*I_GetTime)(false);
    iVar10 = iVar3 - gametime;
    if (iVar10 == 0 || iVar3 < gametime) {
      gametime = iVar3;
      GetPackets();
      return;
    }
    iVar21 = skiptics - iVar10;
    bVar16 = skiptics < iVar10;
    bVar1 = skiptics < iVar10;
    skiptics = iVar21;
    if (iVar21 == 0 || bVar1) {
      skiptics = 0;
    }
    iVar10 = -iVar21;
    gametime = iVar3;
    if (iVar21 < 0 && (iVar21 == 0 || bVar16)) {
      iVar15 = 0;
      local_58 = CONCAT44(local_58._4_4_,iVar10);
      do {
        I_StartTic();
        D_ProcessEvents();
        if ((pauseext != false) || (0x10 < (maketic - gametic) / ticdup)) break;
        G_BuildTiccmd(localcmds + maketic % 0xb4);
        iVar21 = maketic + 1;
        iVar3 = iVar21;
        if (ticdup == 1 || iVar21 == 0) {
LAB_0036e502:
          maketic = iVar3;
          TicSpecial::NewMakeTic(&specials);
        }
        else {
          iVar23 = iVar21 % ticdup;
          if (iVar23 == 0) {
            if (0 < ticdup) {
              iVar13 = -ticdup;
              iVar25 = 0;
              iVar18 = 0;
              iVar27 = 0;
              iVar26 = 0;
              iVar24 = 0;
              iVar23 = 0;
              iVar10 = iVar13;
              do {
                iVar19 = (iVar21 + iVar10) % 0xb4;
                iVar23 = iVar23 + localcmds[iVar19].ucmd.pitch;
                iVar24 = iVar24 + localcmds[iVar19].ucmd.yaw;
                iVar26 = iVar26 + localcmds[iVar19].ucmd.roll;
                iVar27 = iVar27 + localcmds[iVar19].ucmd.forwardmove;
                iVar18 = iVar18 + localcmds[iVar19].ucmd.sidemove;
                iVar25 = iVar25 + localcmds[iVar19].ucmd.upmove;
                iVar10 = iVar10 + 1;
              } while (iVar10 != 0);
              iVar10 = (int)local_58;
              if (0 < ticdup) {
                iVar25 = iVar25 / ticdup;
                iVar18 = iVar18 / ticdup;
                iVar27 = iVar27 / ticdup;
                iVar26 = iVar26 / ticdup;
                iVar24 = iVar24 / ticdup;
                iVar23 = iVar23 / ticdup;
                maketic = iVar21;
                do {
                  iVar3 = (iVar21 + iVar13) % 0xb4;
                  localcmds[iVar3].ucmd.pitch = (short)iVar23;
                  localcmds[iVar3].ucmd.yaw = (short)iVar24;
                  localcmds[iVar3].ucmd.roll = (short)iVar26;
                  localcmds[iVar3].ucmd.forwardmove = (short)iVar27;
                  localcmds[iVar3].ucmd.sidemove = (short)iVar18;
                  localcmds[iVar3].ucmd.upmove = (short)iVar25;
                  iVar13 = iVar13 + 1;
                  iVar3 = maketic;
                } while (iVar13 != 0);
              }
            }
            goto LAB_0036e502;
          }
          iVar24 = iVar21;
          iVar3 = maketic;
          while (maketic = iVar24, iVar21 - iVar23 < iVar3) {
            iVar24 = (int)((ulong)((long)(iVar3 + -1) * -0x49f49f49) >> 0x20) + iVar3 + -1;
            localcmds[((iVar24 >> 7) - (iVar24 >> 0x1f)) * -0xb4 + iVar3 + -1].ucmd.buttons =
                 localcmds[((iVar24 >> 7) - (iVar24 >> 0x1f)) * -0xb4 + iVar3 + -1].ucmd.buttons |
                 localcmds[iVar3 % 0xb4].ucmd.buttons;
            iVar24 = maketic;
            iVar3 = iVar3 + -1;
          }
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < iVar10);
    }
    iVar3 = nettics[0];
    iVar10 = resendto[0];
    if ((singletics == false) &&
       (local_5c = maketic / ticdup, iVar3 = local_5c, iVar10 = local_5c, demoplayback != true)) {
      local_60 = (maketic - iVar15) / ticdup;
      if ((consoleplayer == Net_Arbitrator) && (NetMode == '\x01')) {
        plVar6 = &DAT_017e1fd8;
        iVar3 = 1;
        lVar11 = 0;
        do {
          if (playeringame[lVar11] == true) {
            iVar10 = 1;
            if ((*plVar6 != 0) && (iVar10 = 0, (*(byte *)(*plVar6 + 0x20) & 0x20) != 0)) {
              *plVar6 = 0;
              iVar10 = 1;
            }
            iVar3 = iVar3 + iVar10;
          }
          lVar11 = lVar11 + 1;
          plVar6 = plVar6 + 0x54;
        } while (lVar11 != 8);
        iVar3 = iVar3 + -2;
        uVar2 = doomcom.numnodes;
        if (doomcom.numnodes < 1) {
          iVar10 = 0;
        }
        else {
          lVar11 = 0;
          piVar14 = playerfornode;
          iVar10 = 0;
          do {
            if (nodejustleft[lVar11] == true) {
              if (iVar3 == 0) {
                PlayerIsGone((int)lVar11,*piVar14);
                uVar2 = doomcom.numnodes;
              }
              else {
                iVar10 = iVar10 + 1;
              }
            }
            lVar11 = lVar11 + 1;
            piVar14 = piVar14 + 1;
          } while (lVar11 < (short)uVar2);
        }
        local_68 = iVar3 + (uint)(iVar3 == 0);
        local_64 = iVar10;
      }
      else {
        local_64 = 0;
        local_68 = 1;
        uVar2 = doomcom.numnodes;
      }
      if (0 < (short)uVar2) {
        uVar12 = (ulong)uVar2;
        local_40 = (ulong)local_68;
        local_48 = &DAT_017e1fd8;
        uVar7 = 0;
        do {
          if (((nodeingame[uVar7] == true) &&
              ((((NetMode != '\x01' || (consoleplayer == Net_Arbitrator)) || (uVar7 == 0)) ||
               (uVar7 == (uint)nodeforplayer[Net_Arbitrator])))) &&
             ((((local_5c != local_60 || (0 < resendcount[uVar7])) || (remoteresend[uVar7] != false)
               ) || (nettics[uVar7] == 0)))) {
            local_74 = maketic / ticdup;
            piVar14 = (int *)((long)maketic % (long)ticdup & 0xffffffff);
            doomcom.data[0] = '\0';
            local_50 = resendto[uVar7];
            doomcom.data[1] = (BYTE)local_50;
            uVar20 = 2;
            if (((NetMode == '\x01') && (uVar7 != 0)) &&
               (piVar14 = &consoleplayer, consoleplayer == Net_Arbitrator)) {
              if (1 < (int)uVar12) {
                uVar20 = 1;
                do {
                  if (nodeingame[uVar20] == true) {
                    uVar4 = nettics[uVar20];
                    if ((int)local_74 <= nettics[uVar20]) {
                      uVar4 = local_74;
                    }
                    piVar14 = (int *)(ulong)uVar4;
                    if (uVar7 != uVar20) {
                      local_74 = uVar4;
                    }
                  }
                  uVar20 = uVar20 + 1;
                } while ((uVar12 & 0xffffffff) != uVar20);
              }
              doomcom.data[2] = (BYTE)local_74;
              uVar20 = 3;
            }
            iVar10 = local_74 - local_50;
            iVar3 = 0;
            if (0 < iVar10) {
              iVar3 = iVar10;
            }
            if (0x24 < iVar10) {
              I_Error("NetUpdate: Node %d missed too many tics",uVar7,piVar14);
            }
            if (net_extratic.Value == 2) {
              uVar4 = nettics[uVar7];
            }
            else {
              uVar4 = local_74;
              if (net_extratic.Value == 1) {
                uVar4 = 1;
                if (1 < (int)local_74) {
                  uVar4 = local_74;
                }
                uVar4 = uVar4 - 1;
              }
            }
            resendto[uVar7] = uVar4;
            if ((((0 < iVar10) || (local_5c != local_60)) || ((remoteresend[uVar7] & 1U) != 0)) ||
               (nettics[uVar7] == 0)) {
              uVar12 = uVar20;
              if ((remoteresend[uVar7] & 1U) != 0) {
                doomcom.data[0] = doomcom.data[0] | 0x40;
                uVar12 = (ulong)((int)uVar20 + 1);
                doomcom.data[uVar20] = (BYTE)nettics[uVar7];
              }
              bVar8 = (byte)iVar3;
              if (2 < iVar10) {
                doomcom.data[uVar12] = bVar8 - 3;
                bVar8 = 3;
                uVar12 = (ulong)((int)uVar12 + 1);
              }
              iVar15 = (int)uVar12;
              doomcom.data[0] = doomcom.data[0] | bVar8;
              if (0 < local_64) {
                doomcom.data[0] = doomcom.data[0] | 8;
                iVar15 = iVar15 + 1;
                doomcom.data[uVar12] = (BYTE)local_64;
                if (0 < doomcom.numnodes) {
                  piVar14 = playerfornode;
                  lVar11 = 0;
                  SVar9 = doomcom.numnodes;
                  do {
                    if (nodejustleft[lVar11] == true) {
                      lVar17 = (long)iVar15;
                      iVar15 = iVar15 + 1;
                      doomcom.data[lVar17] = (BYTE)*piVar14;
                      SVar9 = doomcom.numnodes;
                    }
                    lVar11 = lVar11 + 1;
                    piVar14 = piVar14 + 1;
                  } while (lVar11 < SVar9);
                }
              }
              doomcom.data[iVar15] = (BYTE)((maketic - (iVar3 + gametic)) / ticdup);
              iVar3 = iVar15 + 1;
              if (0 < iVar10) {
                if (uVar7 == 0 || (int)local_68 < 2) {
LAB_0036ec01:
                  local_70 = doomcom.data + iVar3;
                  if (0 < (int)local_68) goto LAB_0036ec3b;
                }
                else {
                  uVar12 = (ulong)(uint)consoleplayer;
                  if (consoleplayer == Net_Arbitrator) {
                    doomcom.data[0] = doomcom.data[0] | 0x10;
                    iVar3 = iVar15 + 2;
                    doomcom.data[(long)iVar15 + 1] = (BYTE)local_68;
                    if (NetMode == '\x01') {
                      iVar10 = 1;
                      uVar20 = 0;
                      plVar6 = local_48;
                      do {
                        if (playeringame[uVar20] == true) {
                          if (*plVar6 != 0) {
                            if ((*(byte *)(*plVar6 + 0x20) & 0x20) == 0) goto LAB_0036ebbc;
                            *plVar6 = 0;
                          }
                          if ((uVar12 != uVar20) && (uVar20 != (uint)playerfornode[uVar7])) {
                            lVar11 = (long)iVar10;
                            iVar10 = iVar10 + 1;
                            abStack_38[lVar11] = (byte)uVar20;
                            lVar11 = (long)iVar3;
                            iVar3 = iVar3 + 1;
                            doomcom.data[lVar11] = (byte)uVar20;
                          }
                        }
LAB_0036ebbc:
                        uVar20 = uVar20 + 1;
                        plVar6 = plVar6 + 0x54;
                      } while (uVar20 != 8);
                      goto LAB_0036ec01;
                    }
                  }
                  local_70 = doomcom.data + iVar3;
LAB_0036ec3b:
                  local_58 = 0;
                  uVar4 = local_50;
                  do {
                    iVar3 = ticdup;
                    iVar10 = (int)uVar4 % 0x24;
                    if (local_58 == 0) {
                      iVar15 = (int)(ticdup * uVar4) % 0xb4;
                      WriteWord(localcmds[iVar15].consistancy,&local_70);
                      if (specials.used[iVar10] != 0) {
                        memcpy(local_70,specials.streams[iVar10],specials.used[iVar10]);
                        local_70 = local_70 + specials.used[iVar10];
                      }
                      iVar3 = (int)(iVar3 * (uVar4 - 1)) % 0xb4;
                      basis_00 = localcmds + iVar3;
                      if (iVar3 < 0) {
                        basis_00 = (ticcmd_t *)0x0;
                      }
                      WriteUserCmdMessage(&localcmds[iVar15].ucmd,&basis_00->ucmd,&local_70);
                    }
                    else if (uVar7 != 0) {
                      bVar8 = abStack_38[local_58];
                      uVar12 = (ulong)bVar8;
                      lVar11 = (long)iVar10;
                      local_4c = uVar4 - 1;
                      WriteWord(*(short *)(uVar12 * 0x2d0 + 0x17d8f90 + lVar11 * 0x14),&local_70);
                      iVar3 = (uint)bVar8 * 8 + (uint)bVar8;
                      __n = (size_t)*(int *)((long)&NetSpecs[0][lVar11].m_Len +
                                            (ulong)(uint)(iVar3 * 0x40));
                      __src = *(void **)((long)&NetSpecs[0][lVar11].m_Data +
                                        (ulong)(uint)(iVar3 * 0x40));
                      if (__src != (void *)0x0 && __n != 0) {
                        memcpy(local_70,__src,__n);
                        local_70 = local_70 + __n;
                      }
                      uVar5 = ((local_4c / 0x24) * -0x24 + uVar4) - 1;
                      basis = &netcmds[uVar12][uVar5].ucmd;
                      if ((int)uVar5 < 0) {
                        basis = (usercmd_t *)0x0;
                      }
                      WriteUserCmdMessage(&netcmds[uVar12][lVar11].ucmd,basis,&local_70);
                    }
                    uVar4 = uVar4 + 1;
                  } while ((local_74 != uVar4) ||
                          (local_58 = local_58 + 1, uVar4 = local_50, local_58 != local_40));
                }
                iVar3 = (int)local_70 + -0x17d38b4;
              }
              HSendPacket((int)uVar7,iVar3);
            }
          }
          uVar7 = uVar7 + 1;
          uVar12 = (ulong)doomcom.numnodes;
        } while ((long)uVar7 < (long)uVar12);
      }
      GetPackets();
      iVar3 = nettics[0];
      iVar10 = resendto[0];
      if ((local_5c != local_60) && (consoleplayer != Net_Arbitrator)) {
        if (NetMode == '\0') {
          iVar3 = nodeforplayer[Net_Arbitrator];
          iVar10 = 0;
          if (net_ticbalance.Value == true) {
            iVar24 = 0;
            iVar25 = 0;
            iVar26 = 0;
            iVar27 = 0;
            lVar11 = 0;
            iVar10 = 0;
            iVar15 = 0;
            iVar21 = 0;
            iVar23 = 0;
            do {
              iVar24 = iVar24 + *(int *)((long)netdelay[iVar3] + lVar11);
              iVar25 = iVar25 + *(int *)((long)netdelay[iVar3] + lVar11 + 4);
              iVar26 = iVar26 + *(int *)((long)netdelay[iVar3] + lVar11 + 8);
              iVar27 = iVar27 + *(int *)((long)netdelay[iVar3] + lVar11 + 0xc);
              iVar10 = iVar10 + *(int *)((long)netdelay[0] + lVar11);
              iVar15 = iVar15 + *(int *)((long)netdelay[0] + lVar11 + 4);
              iVar21 = iVar21 + *(int *)((long)netdelay[0] + lVar11 + 8);
              iVar23 = iVar23 + *(int *)((long)netdelay[0] + lVar11 + 0xc);
              lVar11 = lVar11 + 0x10;
            } while (lVar11 != 0x90);
            iVar24 = (iVar27 + iVar25 + iVar26 + iVar24) / 0x24;
            iVar15 = (iVar23 + iVar15 + iVar21 + iVar10) / 0x24;
            if (iVar15 < iVar24) {
              iVar10 = (iVar24 + iVar15) / 2;
              lastaverage = iVar10;
            }
            else {
              iVar10 = lastaverage;
              if (0 < lastaverage && iVar24 + 2 < iVar15) {
                iVar10 = lastaverage + -1;
                lastaverage = iVar10;
              }
            }
          }
          mastertics = iVar10 + nettics[iVar3];
        }
        if ((nettics[0] <= mastertics) && (gametime = gametime + -1, debugfile != (FILE *)0x0)) {
          fputc(0x2d,(FILE *)debugfile);
        }
        bVar16 = 3 < oldnettics - mastertics;
        if (NetMode != '\x01') {
          bVar16 = mastertics < oldnettics;
        }
        uVar4 = maketic / ticdup & 3;
        frameskip[uVar4] = (uint)bVar16;
        auVar22._0_4_ = -(uint)(frameskip[0] == 0);
        auVar22._4_4_ = -(uint)(frameskip[1] == 0);
        auVar22._8_4_ = -(uint)(frameskip[2] == 0);
        auVar22._12_4_ = -(uint)(frameskip[3] == 0);
        iVar3 = movmskps(uVar4,auVar22);
        if ((iVar3 == 0) && (skiptics = 1, debugfile != (FILE *)0x0)) {
          fputc(0x2b,(FILE *)debugfile);
        }
        oldnettics = nettics[0];
        iVar3 = nettics[0];
        iVar10 = resendto[0];
      }
    }
  }
  resendto[0] = iVar10;
  nettics[0] = iVar3;
  return;
}

Assistant:

TicSpecial &operator << (float it)
	{
		if (streamptr)
		{
			CheckSpace (4);
			WriteFloat (it, &streamptr);
		}
		return *this;
	}